

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall Connection::onDataAvailable(Connection *this,SharedPtr *client,Buffer *buf)

{
  Buffers *__position;
  _Alloc_hider args_1;
  uint uVar1;
  undefined8 *puVar2;
  ssize_t sVar3;
  uint *puVar4;
  ulong uVar5;
  undefined *in_RCX;
  int __fd;
  shared_ptr<Message> *args;
  Log *pLVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  LinkedList<Buffer> *__range1;
  uint uVar8;
  long lVar9;
  void *__buf;
  shared_ptr<Connection> that;
  shared_ptr<Message> message;
  MessageError error;
  anon_union_4_2_9a7a2496 anon_var_0;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_4108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4100;
  undefined1 local_40f8 [16];
  _Alloc_hider local_40e8;
  SharedPtr *local_40e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40d8;
  _Alloc_hider local_40c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40c0;
  undefined8 local_40b0;
  _Any_data *local_40a8;
  Signal<std::function<void_(std::shared_ptr<Connection>,_int)>_> *local_40a0;
  Signal<std::function<void_(std::shared_ptr<Message>,_std::shared_ptr<Connection>)>_> *local_4098;
  Log local_4090;
  Log local_4080;
  Log local_4070;
  Log local_4060;
  Log local_4050;
  uint local_4040 [4096];
  uint *local_40;
  void *local_38;
  SharedPtr *pSVar6;
  
  __position = &this->mBuffers;
  local_4098 = &this->mNewMessage;
  local_40e8._M_p = (pointer)&this->mFinishStatus;
  local_40a0 = &this->mFinished;
  local_40a8 = (_Any_data *)&this->mErrorHandler;
  local_40e0 = client;
  local_40b0 = buf;
  do {
    if (buf->bufferSize != 0) {
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_insert<Buffer>
                ((list<Buffer,_std::allocator<Buffer>_> *)__position,(iterator)__position,buf);
    }
    lVar9 = 0;
    for (puVar2 = &((__position->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                    super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
                    super__List_node_base._M_next)->_M_next; (Buffers *)puVar2 != __position;
        puVar2 = (undefined8 *)*puVar2) {
      lVar9 = lVar9 + puVar2[3];
    }
    uVar8 = (int)lVar9 - (int)(this->mBuffers).mBufferOffset;
    if (uVar8 == 0) {
      return;
    }
    uVar1 = this->mPendingRead;
    if (uVar1 == 0) {
      if (uVar8 < 4) {
        return;
      }
      sVar3 = Buffers::read(__position,(int)local_4040,(void *)0x4,(size_t)in_RCX);
      if ((int)sVar3 != 4) {
        __assert_fail("read == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x83,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      this->mPendingRead = local_4040[0];
      if ((int)local_4040[0] < 1) {
        __assert_fail("mPendingRead > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x85,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      uVar8 = uVar8 - 4;
      uVar1 = local_4040[0];
    }
    else if ((int)uVar1 < 0) {
      __assert_fail("mPendingRead >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x88,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    if (uVar8 < uVar1) {
      return;
    }
    __buf = (void *)(ulong)uVar1;
    puVar4 = local_4040;
    local_38 = __buf;
    if (0x4000 < uVar1) {
      puVar4 = (uint *)operator_new__((ulong)__buf);
    }
    local_40 = puVar4;
    uVar5 = Buffers::read(__position,(int)puVar4,__buf,(size_t)in_RCX);
    if (this->mPendingRead != (int)uVar5) {
      __assert_fail("read == mPendingRead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x8e,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    this->mPendingRead = 0;
    local_40d8._M_allocated_capacity._0_4_ = 0;
    local_40d8._8_8_ = &local_40c0;
    local_40c8._M_p = (pointer)0x0;
    local_40c0._M_local_buf[0] = '\0';
    in_RCX = (undefined *)(uVar5 & 0xffffffff);
    Message::create((Message *)local_40f8,this->mVersion,(char *)local_40,(int)uVar5,
                    (MessageError *)&local_40d8);
    if ((element_type *)local_40f8._0_8_ == (element_type *)0x0) {
      if ((this->mErrorHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_4108.mValue = 1;
        Log::Log(&local_4080,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_4108);
        Log::write(&local_4070,(int)&local_4080,"Unable to create message from data",0xffffffff);
        Log::addStringStream<int>(&local_4090,(int)&local_4070);
        in_RCX = (undefined *)((ulong)local_40c8._M_p & 0xffffffff);
        Log::write((Log *)&local_4108,(int)&local_4090,(void *)local_40d8._8_8_,(size_t)in_RCX);
        buf = (Buffer *)local_40b0;
        if (local_4100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4100);
        }
        Log::Log(&local_4060,&local_4090);
        pLVar7 = &local_4060;
        Log::addStringStream<int>(&local_4050,(int)&local_4060);
        __fd = (int)pLVar7;
        if (local_4050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_00._M_pi =
             local_4080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_4070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_4080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        goto LAB_00142889;
      }
      pSVar6 = local_40e0;
      (*(this->mErrorHandler)._M_invoker)(local_40a8,local_40e0,(MessageError *)&local_40d8);
      __fd = (int)pSVar6;
    }
    else {
      std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
                ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_4108,
                 (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      args_1._M_p = local_40e8._M_p;
      if (*(uint8_t *)(local_40f8._0_8_ + 8) == '\x02') {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f8._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(int *)local_40e8._M_p =
               *(int *)&((element_type *)(local_40f8._0_8_ + 0x50))->_vptr_Message;
        }
        else {
          in_RCX = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_40f8._8_8_ + 8) = *(_Atomic_word *)(local_40f8._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_40f8._8_8_ + 8) = *(_Atomic_word *)(local_40f8._8_8_ + 8) + 1;
          }
          *(int *)local_40e8._M_p =
               *(int *)&((element_type *)(local_40f8._0_8_ + 0x50))->_vptr_Message;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f8._8_8_);
        }
        __fd = (int)&local_4108;
        Signal<std::function<void(std::shared_ptr<Connection>,int)>>::operator()
                  (local_40a0,(shared_ptr<Connection> *)&local_4108,(int *)args_1._M_p);
        this_00._M_pi = local_4100;
      }
      else {
        args = (shared_ptr<Message> *)local_40f8;
        Signal<std::function<void(std::shared_ptr<Message>,std::shared_ptr<Connection>)>>::
        operator()(local_4098,args,(shared_ptr<Connection> *)&local_4108);
        __fd = (int)args;
        this_00._M_pi = local_4100;
      }
LAB_00142889:
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    if ((element_type *)local_40f8._0_8_ == (element_type *)0x0) {
      SocketClient::close((local_40e0->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr,__fd);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40f8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40d8._8_8_ != &local_40c0) {
      operator_delete((void *)local_40d8._8_8_);
    }
    if (((void *)0x4000 < local_38) && (local_40 != (uint *)0x0)) {
      operator_delete__(local_40);
    }
  } while( true );
}

Assistant:

void Connection::onDataAvailable(const SocketClient::SharedPtr &client, Buffer&& buf)
{
    while (true) {
        if (!buf.isEmpty())
            mBuffers.push(std::forward<Buffer>(buf));

        unsigned int available = mBuffers.size();
        if (!available)
            break;
        if (!mPendingRead) {
            if (available < static_cast<int>(sizeof(uint32_t)))
                break;
            union {
                unsigned char b[sizeof(uint32_t)];
                int pending;
            };
            const int read = mBuffers.read(b, 4);
            assert(read == 4);
            mPendingRead = pending;
            assert(mPendingRead > 0);
            available -= read;
        }
        assert(mPendingRead >= 0);
        if (available < static_cast<unsigned int>(mPendingRead))
            break;

        StackBuffer<1024 * 16> buffer(mPendingRead);
        const int read = mBuffers.read(buffer.buffer(), mPendingRead);
        assert(read == mPendingRead);
        mPendingRead = 0;
        Message::MessageError error;
        std::shared_ptr<Message> message = Message::create(mVersion, buffer, read, &error);
        if (message) {
            auto that = shared_from_this();
            if (message->messageId() == FinishMessage::MessageId) {
                mFinishStatus = std::static_pointer_cast<FinishMessage>(message)->status();
                mFinished(that, mFinishStatus);
            } else {
                newMessage()(message, that);
            }
        } else if (mErrorHandler) {
            mErrorHandler(client, std::move(error));
        } else {
            ::error() << "Unable to create message from data" << error.type << error.text << read;
        }
        if (!message)
            client->close();
    }
}